

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall
chrono::ChParticleCloud::ChParticleCloud(ChParticleCloud *this,ChParticleCloud *other)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  ChVector<double> iner;
  ChVector<double> local_28;
  
  ChIndexedParticles::ChIndexedParticles
            (&this->super_ChIndexedParticles,&other->super_ChIndexedParticles);
  (this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChParticleCloud_01159f20;
  (this->particles).
  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->particles).
  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->particles).
  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ChSharedMassBody::ChSharedMassBody(&this->particle_mass);
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->do_collide = other->do_collide;
  this->do_limit_speed = other->do_limit_speed;
  SetMass(this,(other->particle_mass).mass);
  local_28.m_data[0] =
       (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_28.m_data[1] =
       (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_28.m_data[2] =
       (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  SetInertiaXX(this,&local_28);
  local_28.m_data[0] =
       (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_28.m_data[1] =
       (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_28.m_data[2] =
       (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  SetInertiaXY(this,&local_28);
  (*this->particle_collision_model->_vptr_ChCollisionModel[3])();
  iVar4 = (*((other->matsurface).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ChMaterialSurface[2])();
  std::__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChMaterialSurface,void>
            ((__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (ChMaterialSurface *)CONCAT44(extraout_var,iVar4));
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->matsurface).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28.m_data + 1));
  uVar5 = (*(other->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])
                    (other);
  (*(this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3e])
            (this,(ulong)uVar5);
  this->sleep_starttime = other->sleep_starttime;
  fVar1 = other->max_wvel;
  fVar2 = other->sleep_time;
  fVar3 = other->sleep_minspeed;
  this->max_speed = other->max_speed;
  this->max_wvel = fVar1;
  this->sleep_time = fVar2;
  this->sleep_minspeed = fVar3;
  this->sleep_minwvel = other->sleep_minwvel;
  return;
}

Assistant:

ChParticleCloud::ChParticleCloud(const ChParticleCloud& other) : ChIndexedParticles(other) {
    do_collide = other.do_collide;
    do_limit_speed = other.do_limit_speed;

    SetMass(other.GetMass());
    SetInertiaXX(other.GetInertiaXX());
    SetInertiaXY(other.GetInertiaXY());

    particle_collision_model->ClearModel();

    matsurface = std::shared_ptr<ChMaterialSurface>(other.matsurface->Clone());  // deep copy

    ResizeNparticles((int)other.GetNparticles());

    max_speed = other.max_speed;
    max_wvel = other.max_wvel;

    sleep_time = other.sleep_time;
    sleep_starttime = other.sleep_starttime;
    sleep_minspeed = other.sleep_minspeed;
    sleep_minwvel = other.sleep_minwvel;
}